

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrGroup.c
# Opt level: O3

MtrNode * Mtr_MakeGroup(MtrNode *root,uint low,uint size,uint flags)

{
  uint uVar1;
  MtrNode *pMVar2;
  MtrNode *pMVar3;
  MtrNode *pMVar4;
  uint uVar5;
  MtrNode **ppMVar6;
  uint uVar7;
  MtrNode *pMVar8;
  
  if (size != 0) {
    uVar1 = size + low;
    uVar5 = root->low;
    do {
      pMVar8 = root;
      if (low < uVar5) {
        return (MtrNode *)0x0;
      }
      if (pMVar8->size + uVar5 < uVar1) {
        return (MtrNode *)0x0;
      }
      if ((uVar5 == low) && (pMVar8->size == size)) {
        pMVar8->flags = flags;
        return pMVar8;
      }
      root = pMVar8->child;
      if (root == (MtrNode *)0x0) {
        pMVar2 = Mtr_AllocNode();
        if (pMVar2 == (MtrNode *)0x0) {
          return (MtrNode *)0x0;
        }
        pMVar2->low = low;
        pMVar2->size = size;
        pMVar2->flags = flags;
        pMVar2->parent = pMVar8;
        pMVar2->child = (MtrNode *)0x0;
        pMVar2->elder = (MtrNode *)0x0;
        pMVar2->younger = (MtrNode *)0x0;
        pMVar8->child = pMVar2;
        return pMVar2;
      }
      uVar5 = root->low;
      uVar7 = root->size + uVar5;
      if (low < uVar7) {
        pMVar2 = (MtrNode *)0x0;
      }
      else {
        do {
          pMVar2 = root;
          root = pMVar2->younger;
          if (root == (MtrNode *)0x0) {
            pMVar4 = Mtr_AllocNode();
            if (pMVar4 == (MtrNode *)0x0) {
              return (MtrNode *)0x0;
            }
            pMVar4->low = low;
            pMVar4->size = size;
            pMVar4->flags = flags;
            pMVar4->parent = pMVar8;
            pMVar4->elder = pMVar2;
            pMVar2->younger = pMVar4;
            pMVar4->child = (MtrNode *)0x0;
            pMVar4->younger = (MtrNode *)0x0;
            return pMVar4;
          }
          uVar5 = root->low;
          uVar7 = root->size + uVar5;
        } while (uVar7 <= low);
      }
      if (low < uVar5) {
        if (uVar1 <= uVar5) {
          pMVar4 = Mtr_AllocNode();
          if (pMVar4 == (MtrNode *)0x0) {
            return (MtrNode *)0x0;
          }
          pMVar4->low = low;
          pMVar4->size = size;
          pMVar4->flags = flags;
          pMVar4->child = (MtrNode *)0x0;
          pMVar4->parent = pMVar8;
          pMVar4->elder = pMVar2;
          pMVar4->younger = root;
          root->elder = pMVar4;
          if (pMVar2 == (MtrNode *)0x0) {
            pMVar8->child = pMVar4;
            return pMVar4;
          }
          pMVar2->younger = pMVar4;
          return pMVar4;
        }
        if (uVar1 < uVar7) {
          return (MtrNode *)0x0;
        }
        goto LAB_0081bf2a;
      }
    } while (uVar1 <= uVar7);
    if (low <= uVar5) {
LAB_0081bf2a:
      pMVar4 = root;
      do {
        pMVar4 = pMVar4->younger;
        if (pMVar4 == (MtrNode *)0x0) {
          pMVar4 = Mtr_AllocNode();
          if (pMVar4 == (MtrNode *)0x0) {
            return (MtrNode *)0x0;
          }
          pMVar4->low = low;
          pMVar4->size = size;
          pMVar4->flags = flags;
          pMVar4->child = root;
          pMVar4->parent = pMVar8;
          pMVar4->elder = pMVar2;
          pMVar4->younger = (MtrNode *)0x0;
          root->elder = (MtrNode *)0x0;
          ppMVar6 = &pMVar2->younger;
          if (pMVar2 == (MtrNode *)0x0) {
            ppMVar6 = &pMVar8->child;
          }
          *ppMVar6 = pMVar4;
          do {
            root->parent = pMVar4;
            root = root->younger;
          } while (root != (MtrNode *)0x0);
          return pMVar4;
        }
        uVar5 = pMVar4->size + pMVar4->low;
      } while (uVar5 < uVar1);
      if ((uVar1 - 1 < pMVar4->low || uVar5 <= uVar1) &&
         (pMVar3 = Mtr_AllocNode(), pMVar3 != (MtrNode *)0x0)) {
        pMVar3->low = low;
        pMVar3->size = size;
        pMVar3->flags = flags;
        pMVar3->child = root;
        pMVar3->parent = pMVar8;
        ppMVar6 = &pMVar2->younger;
        if (pMVar2 == (MtrNode *)0x0) {
          ppMVar6 = &pMVar8->child;
        }
        *ppMVar6 = pMVar3;
        pMVar3->elder = pMVar2;
        pMVar8 = pMVar4->younger;
        pMVar3->younger = pMVar8;
        if (pMVar8 != (MtrNode *)0x0) {
          pMVar8->elder = pMVar3;
        }
        pMVar4->younger = (MtrNode *)0x0;
        root->elder = (MtrNode *)0x0;
        do {
          root->parent = pMVar3;
          root = root->younger;
        } while (root != (MtrNode *)0x0);
        return pMVar3;
      }
    }
  }
  return (MtrNode *)0x0;
}

Assistant:

MtrNode *
Mtr_MakeGroup(
  MtrNode * root /* root of the group tree */,
  unsigned int  low /* lower bound of the group */,
  unsigned int  size /* upper bound of the group */,
  unsigned int  flags /* flags for the new group */)
{
    MtrNode *node,
            *first,
            *last,
            *previous,
            *newn;

    /* Sanity check. */
    if (size == 0)
        return(NULL);

    /* Check whether current group includes new group.  This check is
    ** necessary at the top-level call.  In the subsequent calls it is
    ** redundant. */
    if (low < (unsigned int) root->low ||
        low + size > (unsigned int) (root->low + root->size))
        return(NULL);

    /* Trying to create an existing group has the effect of updating
    ** the flags. */
    if (root->size == size && root->low == low) {
        root->flags = flags;
        return(root);
    }

    /* At this point we know that the new group is properly contained
    ** in the group of root. We have two possible cases here: - root
    ** is a terminal node; - root has children. */

    /* Root has no children: create a new group. */
    if (root->child == NULL) {
        newn = Mtr_AllocNode();
        if (newn == NULL) return(NULL); /* out of memory */
        newn->low = low;
        newn->size = size;
        newn->flags = flags;
        newn->parent = root;
        newn->elder = newn->younger = newn->child = NULL;
        root->child = newn;
        return(newn);
    }

    /* Root has children: Find all chidren of root that are included
    ** in the new group. If the group of any child entirely contains
    ** the new group, call Mtr_MakeGroup recursively. */
    previous = NULL;
    first = root->child; /* guaranteed to be non-NULL */
    while (first != NULL && low >= (unsigned int) (first->low + first->size)) {
        previous = first;
        first = first->younger;
    }
    if (first == NULL) {
        /* We have scanned the entire list and we need to append a new
        ** child at the end of it.  Previous points to the last child
        ** of root. */
        newn = Mtr_AllocNode();
        if (newn == NULL) return(NULL); /* out of memory */
        newn->low = low;
        newn->size = size;
        newn->flags = flags;
        newn->parent = root;
        newn->elder = previous;
        previous->younger = newn;
        newn->younger = newn->child = NULL;
        return(newn);
    }
    /* Here first is non-NULL and low < first->low + first->size. */
    if (low >= (unsigned int) first->low &&
        low + size <= (unsigned int) (first->low + first->size)) {
        /* The new group is contained in the group of first. */
        newn = Mtr_MakeGroup(first, low, size, flags);
        return(newn);
    } else if (low + size <= first->low) {
        /* The new group is entirely contained in the gap between
        ** previous and first. */
        newn = Mtr_AllocNode();
        if (newn == NULL) return(NULL); /* out of memory */
        newn->low = low;
        newn->size = size;
        newn->flags = flags;
        newn->child = NULL;
        newn->parent = root;
        newn->elder = previous;
        newn->younger = first;
        first->elder = newn;
        if (previous != NULL) {
            previous->younger = newn;
        } else {
            root->child = newn;
        }
        return(newn);
    } else if (low < (unsigned int) first->low &&
               low + size < (unsigned int) (first->low + first->size)) {
        /* Trying to cut an existing group: not allowed. */
        return(NULL);
    } else if (low > first->low) {
        /* The new group neither is contained in the group of first
        ** (this was tested above) nor contains it. It is therefore
        ** trying to cut an existing group: not allowed. */
        return(NULL);
    }

    /* First holds the pointer to the first child contained in the new
    ** group. Here low <= first->low and low + size >= first->low +
    ** first->size.  One of the two inequalities is strict. */
    last = first->younger;
    while (last != NULL &&
           (unsigned int) (last->low + last->size) < low + size) {
        last = last->younger;
    }
    if (last == NULL) {
        /* All the chilren of root from first onward become children
        ** of the new group. */
        newn = Mtr_AllocNode();
        if (newn == NULL) return(NULL); /* out of memory */
        newn->low = low;
        newn->size = size;
        newn->flags = flags;
        newn->child = first;
        newn->parent = root;
        newn->elder = previous;
        newn->younger = NULL;
        first->elder = NULL;
        if (previous != NULL) {
            previous->younger = newn;
        } else {
            root->child = newn;
        }
        last = first;
        while (last != NULL) {
            last->parent = newn;
            last = last->younger;
        }
        return(newn);
    }

    /* Here last != NULL and low + size <= last->low + last->size. */
    if (low + size - 1 >= (unsigned int) last->low &&
        low + size < (unsigned int) (last->low + last->size)) {
        /* Trying to cut an existing group: not allowed. */
        return(NULL);
    }

    /* First and last point to the first and last of the children of
    ** root that are included in the new group. Allocate a new node
    ** and make all children of root between first and last chidren of
    ** the new node.  Previous points to the child of root immediately
    ** preceeding first. If it is NULL, then first is the first child
    ** of root. */
    newn = Mtr_AllocNode();
    if (newn == NULL) return(NULL);     /* out of memory */
    newn->low = low;
    newn->size = size;
    newn->flags = flags;
    newn->child = first;
    newn->parent = root;
    if (previous == NULL) {
        root->child = newn;
    } else {
        previous->younger = newn;
    }
    newn->elder = previous;
    newn->younger = last->younger;
    if (last->younger != NULL) {
        last->younger->elder = newn;
    }
    last->younger = NULL;
    first->elder = NULL;
    for (node = first; node != NULL; node = node->younger) {
        node->parent = newn;
    }

    return(newn);

}